

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void xLearn::AUCMetric::auc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,Info *info,size_t start_idx,size_t end_idx)

{
  ostream *poVar1;
  const_reference pvVar2;
  ostream *poVar3;
  reference pvVar4;
  ulong in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  ulong in_R8;
  index_t bkt_id;
  real_t sigmoid_score;
  real_t r_label;
  size_t i;
  Logger *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int iVar5;
  string *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  LogSeverity LVar6;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  Logger local_a8;
  uint local_a4;
  real_t local_a0;
  float local_9c;
  ulong local_98;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  Logger local_2c;
  ulong local_28;
  ulong local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  LVar6 = (LogSeverity)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_98 = in_RCX;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R8 < in_RCX) {
    local_20 = in_RCX;
    Logger::Logger(&local_2c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"auc_accum_thread",&local_89);
    poVar1 = Logger::Start(LVar6,in_stack_fffffffffffffea8,iVar5,in_stack_fffffffffffffe98);
    poVar1 = std::operator<<(poVar1,"CHECK_GE failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,499);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"end_idx");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"start_idx");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Logger::~Logger(in_stack_fffffffffffffe30);
    abort();
  }
  while( true ) {
    if (local_28 <= local_98) {
      return;
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_8,local_98);
    local_9c = (float)(int)(((0.0 < *pvVar2) - 1) + (uint)(0.0 < *pvVar2));
    std::vector<float,_std::allocator<float>_>::operator[](local_10,local_98);
    local_a0 = fastsigmoid(0.0);
    LVar6 = (LogSeverity)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    local_a4 = vcvttss2usi_avx512f(ZEXT416((uint)(local_a0 * 1e+06)));
    local_a4 = local_a4 % 1000000;
    if (999999 < local_a4) break;
    if (local_9c <= 0.0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18 + 1,(ulong)local_a4);
      *pvVar4 = *pvVar4 + 1;
    }
    else {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)local_a4);
      *pvVar4 = *pvVar4 + 1;
    }
    local_98 = local_98 + 1;
  }
  Logger::Logger(&local_a8,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"auc_accum_thread",&local_f1);
  poVar1 = Logger::Start(LVar6,in_stack_fffffffffffffea8,iVar5,in_stack_fffffffffffffe98);
  poVar1 = std::operator<<(poVar1,"CHECK_LT failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1f9);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"bkt_id");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_a4);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar3 = std::operator<<(poVar1,"kMaxBucketSize");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1000000);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  Logger::~Logger((Logger *)poVar1);
  abort();
}

Assistant:

static void auc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               Info* info,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      real_t sigmoid_score = fastsigmoid((*pred)[i]);
      index_t bkt_id = index_t(sigmoid_score * kMaxBucketSize) 
                       % kMaxBucketSize;
      CHECK_LT(bkt_id, kMaxBucketSize);
      if (r_label > 0) {
        info->positive_vec_[bkt_id] += 1;
      } else {
        info->negative_vec_[bkt_id] += 1;
      }
    }
  }